

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodemb.c
# Opt level: O0

void av1_setup_xform(AV1_COMMON *cm,MACROBLOCK *x,TX_SIZE tx_size,TX_TYPE tx_type,
                    TxfmParam *txfm_param)

{
  MB_MODE_INFO *mbmi_00;
  TxSetType TVar1;
  int iVar2;
  undefined1 in_CL;
  TX_SIZE in_DL;
  long in_RSI;
  long in_RDI;
  undefined1 *in_R8;
  MB_MODE_INFO *mbmi;
  MACROBLOCKD *xd;
  
  mbmi_00 = (MB_MODE_INFO *)**(undefined8 **)(in_RSI + 0x2058);
  *in_R8 = in_CL;
  in_R8[1] = in_DL;
  *(undefined4 *)(in_R8 + 4) =
       *(undefined4 *)(in_RSI + 0x2b64 + (ulong)((byte)*(undefined2 *)&mbmi_00->field_0xa7 & 7) * 4)
  ;
  iVar2 = is_inter_block(mbmi_00);
  TVar1 = av1_get_ext_tx_set_type(in_DL,iVar2,(uint)(*(byte *)(in_RDI + 0x1f5) & 1));
  in_R8[0x10] = TVar1;
  *(undefined4 *)(in_R8 + 8) = *(undefined4 *)(in_RSI + 0x2b40);
  iVar2 = is_cur_buf_hbd((MACROBLOCKD *)(in_RSI + 0x1a0));
  *(int *)(in_R8 + 0xc) = iVar2;
  return;
}

Assistant:

void av1_setup_xform(const AV1_COMMON *cm, MACROBLOCK *x, TX_SIZE tx_size,
                     TX_TYPE tx_type, TxfmParam *txfm_param) {
  MACROBLOCKD *const xd = &x->e_mbd;
  MB_MODE_INFO *const mbmi = xd->mi[0];

  txfm_param->tx_type = tx_type;
  txfm_param->tx_size = tx_size;
  txfm_param->lossless = xd->lossless[mbmi->segment_id];
  txfm_param->tx_set_type = av1_get_ext_tx_set_type(
      tx_size, is_inter_block(mbmi), cm->features.reduced_tx_set_used);

  txfm_param->bd = xd->bd;
  txfm_param->is_hbd = is_cur_buf_hbd(xd);
}